

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::key(Forth *this)

{
  uint x;
  stringstream *psVar1;
  
  requireDStackAvailable(this,1,"KEY");
  if (this->readFromSource == FromStdCin) {
    psVar1 = (stringstream *)&std::cin;
  }
  else {
    x = 0xffffffff;
    if (this->readFromSource != FromString) goto LAB_0010fc8d;
    psVar1 = &this->std_cin;
  }
  std::ios::clear((int)*(undefined8 *)(*(long *)psVar1 + -0x18) + (int)psVar1);
  x = std::istream::get();
LAB_0010fc8d:
  ForthStack<unsigned_int>::push(&this->dStack,x);
  return;
}

Assistant:

void key() {
				REQUIRE_DSTACK_AVAILABLE(1, "KEY");
				SCell ch = EOF;
				switch (readFromSource) {
				case FromString:
					std_cin.clear();
					ch = static_cast<SCell>(std_cin.get());
					break;
				case FromStdCin:
					std::cin.clear();
					ch = static_cast<SCell>(std::cin.get());
					break;
				default:
					break;
			}
			push(ch);
		}